

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O3

Ch * __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  Ch *pCVar1;
  Ch *pCVar2;
  char *pcVar3;
  
  pcVar3 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->stack_,1);
  *pcVar3 = '\0';
  pCVar1 = (this->stack_).stack_;
  pCVar2 = (this->stack_).stackTop_;
  if (pCVar2 != pCVar1) {
    (this->stack_).stackTop_ = pCVar2 + -1;
    return pCVar1;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/stack.h"
                ,0x8b,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

const Ch* GetString() const {
        // Push and pop a null terminator. This is safe.
        *stack_.template Push<Ch>() = '\0';
        stack_.template Pop<Ch>(1);

        return stack_.template Bottom<Ch>();
    }